

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  TriviaKind TVar1;
  Trivia *this_00;
  size_type sVar2;
  long lVar3;
  Trivia *t;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar4;
  string_view local_38;
  
  sVar4 = trivia(this);
  this_00 = sVar4.data_;
  for (lVar3 = sVar4.size_ << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    TVar1 = this_00->kind;
    if (TVar1 < (Directive|Whitespace)) {
      if (TVar1 == BlockComment) {
        local_38 = Trivia::getRawText(this_00);
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (&local_38,"\r\n",0);
        if (sVar2 != 0xffffffffffffffff) break;
      }
      else if (TVar1 == 8) {
        if (((this_00->field_0).syntaxNode)->kind != MacroUsage) break;
      }
      else if ((0xecU >> (TVar1 & 0x1f) & 1) != 0) break;
    }
    this_00 = this_00 + 1;
  }
  return lVar3 == 0;
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}